

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           *this)

{
  bool bVar1;
  hasher *hashval_00;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *this_00;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *prVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_RDI;
  FindInfo FVar3;
  anon_class_16_2_f7bee600 probe_index;
  size_t new_i;
  FindInfo target;
  size_t hashval;
  size_t i;
  slot_type *slot;
  type raw;
  slot_type *in_stack_ffffffffffffff78;
  slot_type *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_ffffffffffffff90;
  slot_type *local_48;
  size_t local_28;
  
  bVar1 = IsValidCapacity(in_RDI->capacity_);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                 );
  }
  bVar1 = is_small(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ConvertDeletedToEmptyAndFullToDeleted
              ((ctrl_t *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_28 = 0;
    do {
      if (local_28 == in_RDI->capacity_) {
        reset_growth_left(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        return;
      }
      bVar1 = IsDeleted(in_RDI->ctrl_[local_28]);
      if (bVar1) {
        hashval_00 = hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                               *)0x57ab50);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>::
        element<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>>
                  ((slot_type *)0x57ab72);
        this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                   *)hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
                     ::
                     apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>::HashElement,std::pair<cs_impl::any_const,cs::statement_block*>&,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>>
                               ((HashElement *)&in_stack_ffffffffffffff80->value,
                                &in_stack_ffffffffffffff78->value);
        FVar3 = find_first_non_full(this_00,(size_t)hashval_00);
        local_48 = (slot_type *)FVar3.offset;
        prVar2 = in_RDI;
        in_stack_ffffffffffffff90 =
             (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
              *)drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                          ((anon_class_16_2_f7bee600 *)in_RDI,(size_t)in_RDI);
        prVar2 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                  *)drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                              ((anon_class_16_2_f7bee600 *)prVar2,(size_t)in_RDI);
        if (in_stack_ffffffffffffff90 == prVar2) {
          in_stack_ffffffffffffff88 = local_28;
          H2((size_t)this_00);
          set_ctrl(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
        }
        else {
          bVar1 = IsEmpty(in_RDI->ctrl_[(long)local_48]);
          if (bVar1) {
            H2((size_t)this_00);
            set_ctrl(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (ctrl_t)((ulong)local_48 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)0x57ac70);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
            ::transfer<std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                       &local_48->value,in_stack_ffffffffffffff78,(slot_type *)0x57ac9d);
            set_ctrl(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (ctrl_t)((ulong)local_48 >> 0x38));
            in_stack_ffffffffffffff80 = local_48;
          }
          else {
            bVar1 = IsDeleted(in_RDI->ctrl_[(long)local_48]);
            if (!bVar1) {
              __assert_fail("IsDeleted(ctrl_[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                            ,0x92b,
                            "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
                           );
            }
            H2((size_t)this_00);
            set_ctrl(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                     (ctrl_t)((ulong)in_stack_ffffffffffffff80 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)0x57ad21);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
            ::transfer<std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                       &in_stack_ffffffffffffff80->value,local_48,(slot_type *)0x57ad43);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)0x57ad4d);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
            ::transfer<std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                       &in_stack_ffffffffffffff80->value,local_48,(slot_type *)0x57ad7a);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)0x57ad84);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
            ::transfer<std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
                      ((allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_> *)
                       &in_stack_ffffffffffffff80->value,local_48,(slot_type *)0x57ada6);
            local_28 = local_28 - 1;
            in_stack_ffffffffffffff78 = local_48;
          }
        }
      }
      local_28 = local_28 + 1;
    } while( true );
  }
  __assert_fail("!is_small()",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8f9,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<cs_impl::any, cs::statement_block *>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<std::pair<const cs_impl::any, cs::statement_block *>>]"
               );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}